

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
::Boundary_matrix(Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
                  *this,Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
                        *matrixToCopy,Column_settings *colSettings)

{
  bool bVar1;
  size_type __n;
  reference pvVar2;
  Column_settings *local_70;
  value_type *cont;
  const_iterator __end0;
  const_iterator __begin0;
  Column_container *__range2;
  Column_settings *colSettings_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
  *matrixToCopy_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
  *this_local;
  
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>_>_>_>_>,_true,_unsigned_int>
  ::Matrix_row_access(&this->super_Matrix_row_access_option,
                      &matrixToCopy->super_Matrix_row_access_option);
  std::
  unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>_>_>
  ::unordered_map(&this->matrix_);
  this->nextInsertIndex_ = matrixToCopy->nextInsertIndex_;
  local_70 = colSettings;
  if (colSettings == (Column_settings *)0x0) {
    local_70 = matrixToCopy->colSettings_;
  }
  this->colSettings_ = local_70;
  __n = std::
        unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>_>_>
        ::size(&matrixToCopy->matrix_);
  std::
  unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>_>_>
  ::reserve(&this->matrix_,__n);
  __end0 = std::
           unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>_>_>
           ::begin(&matrixToCopy->matrix_);
  cont = (value_type *)
         std::
         unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>_>_>
         ::end(&matrixToCopy->matrix_);
  while (bVar1 = std::__detail::operator!=
                           (&__end0.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>,_false>
                            ,(_Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>,_false>
                              *)&cont), bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>,_false,_false>
             ::operator*(&__end0);
    _container_insert(this,&pvVar2->second,pvVar2->first);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>,_false,_false>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline Boundary_matrix<Master_matrix>::Boundary_matrix(const Boundary_matrix& matrixToCopy,
                                                       Column_settings* colSettings)
    : Dim_opt(static_cast<const Dim_opt&>(matrixToCopy)),
      Swap_opt(static_cast<const Swap_opt&>(matrixToCopy)),
      Pair_opt(static_cast<const Pair_opt&>(matrixToCopy)),
      RA_opt(static_cast<const RA_opt&>(matrixToCopy)),
      nextInsertIndex_(matrixToCopy.nextInsertIndex_),
      colSettings_(colSettings == nullptr ? matrixToCopy.colSettings_ : colSettings)
{
  matrix_.reserve(matrixToCopy.matrix_.size());
  for (const auto& cont : matrixToCopy.matrix_){
    if constexpr (Master_matrix::Option_list::has_map_column_container){
      _container_insert(cont.second, cont.first);
    } else {
      _container_insert(cont);
    }
  }
}